

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

void InitZopfliCostModel(MemoryManager *m,ZopfliCostModel *self,BrotliDistanceParams *dist,
                        size_t num_bytes)

{
  float *local_40;
  float *local_38;
  uint local_2c;
  uint32_t distance_histogram_size;
  size_t num_bytes_local;
  BrotliDistanceParams *dist_local;
  ZopfliCostModel *self_local;
  MemoryManager *m_local;
  
  local_2c = dist->alphabet_size;
  if (0x220 < local_2c) {
    local_2c = 0x220;
  }
  self->num_bytes_ = num_bytes;
  if (num_bytes == 0xfffffffffffffffe) {
    local_38 = (float *)0x0;
  }
  else {
    local_38 = (float *)BrotliAllocate(m,(num_bytes + 2) * 4);
  }
  self->literal_costs_ = local_38;
  if (dist->alphabet_size == 0) {
    local_40 = (float *)0x0;
  }
  else {
    local_40 = (float *)BrotliAllocate(m,(ulong)dist->alphabet_size << 2);
  }
  self->cost_dist_ = local_40;
  self->distance_histogram_size = local_2c;
  return;
}

Assistant:

static void InitZopfliCostModel(
    MemoryManager* m, ZopfliCostModel* self, const BrotliDistanceParams* dist,
    size_t num_bytes) {
  uint32_t distance_histogram_size = dist->alphabet_size;
  if (distance_histogram_size > BROTLI_MAX_EFFECTIVE_DISTANCE_ALPHABET_SIZE) {
    distance_histogram_size = BROTLI_MAX_EFFECTIVE_DISTANCE_ALPHABET_SIZE;
  }
  self->num_bytes_ = num_bytes;
  self->literal_costs_ = BROTLI_ALLOC(m, float, num_bytes + 2);
  self->cost_dist_ = BROTLI_ALLOC(m, float, dist->alphabet_size);
  self->distance_histogram_size = distance_histogram_size;
  if (BROTLI_IS_OOM(m)) return;
}